

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O3

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_install_snapshot_req(raft_server *this,req_msg *req)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _func_int *p_Var3;
  pointer psVar4;
  log_entry *this_00;
  _func_int **pp_Var5;
  ulong uVar6;
  long *plVar7;
  bool bVar8;
  int iVar9;
  undefined8 uVar10;
  element_type *peVar11;
  buffer *buf;
  size_t sVar12;
  long lVar13;
  long in_RDX;
  undefined **ppuVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  ptr<resp_msg> pVar15;
  ptr<buffer> done_ctx;
  ptr<snapshot_sync_req> sync_req;
  undefined1 local_80 [32];
  undefined1 local_60 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  if ((*(_func_int **)(in_RDX + 8) == req[9].super_msg_base._vptr_msg_base[1]) &&
     (((ulong)req[2].log_entries_.
              super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) == 0)) {
    if (*(int *)&req[8].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage == 2) {
      become_follower((raft_server *)req);
    }
    else {
      if (*(int *)&req[8].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage == 3) {
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (psVar4 != (pointer)0x0) {
          iVar9 = (*(code *)(psVar4->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)()
          ;
          if (1 < iVar9) {
            psVar4 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            msg_if_given_abi_cxx11_
                      ((string *)local_80,
                       "Receive InstallSnapshotRequest from another leader(%d) with same term, there must be a bug, server exits"
                       ,(ulong)*(uint *)(in_RDX + 0x14));
            (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar4,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_install_snapshot_req",0xfb,(string *)local_80);
            if ((buffer *)local_80._0_8_ != (buffer *)(local_80 + 0x10)) {
              operator_delete((void *)local_80._0_8_);
            }
          }
        }
        plVar7 = (long *)**(undefined8 **)&req[4].super_msg_base.dst_;
        (**(code **)(*plVar7 + 0x40))(plVar7,0xfffffff6);
        exit(-1);
      }
      restart_election_timer((raft_server *)req);
    }
  }
  p_Var3 = req[9].super_msg_base._vptr_msg_base[1];
  uVar1 = *(undefined4 *)(in_RDX + 0x14);
  uVar10 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
  peVar11 = (element_type *)operator_new(0xb0);
  (peVar11->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar11->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_001cf278;
  uVar2 = *(undefined4 *)
           &(req->log_entries_).
            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (peVar11->bg_commit_thread_)._M_id._M_thread = (native_handle_type)p_Var3;
  *(undefined4 *)&(peVar11->bg_append_thread_)._M_id._M_thread = 0x11;
  *(undefined4 *)((long)&(peVar11->bg_append_thread_)._M_id._M_thread + 4) = uVar2;
  *(undefined4 *)&peVar11->bg_append_ea_ = uVar1;
  ppuVar14 = &PTR__resp_msg_001cf2c8;
  (peVar11->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__resp_msg_001cf2c8;
  peVar11->initialized_ = (atomic<bool>)(char)uVar10;
  *(int3 *)&peVar11->field_0x31 = (int3)((ulong)uVar10 >> 8);
  peVar11->leader_ = (atomic<int>)(int)((ulong)uVar10 >> 0x20);
  peVar11->id_ = 0;
  peVar11->my_priority_ = 0;
  *(undefined1 *)&peVar11->target_priority_ = 0;
  (peVar11->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar11->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  peVar11->votes_responded_ = 0;
  peVar11->votes_granted_ = 0;
  (peVar11->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)((long)&(peVar11->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x18)
       = 0;
  *(undefined8 *)((long)&(peVar11->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x20)
       = 0;
  *(undefined8 *)((long)&(peVar11->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) =
       0;
  *(undefined8 *)((long)&(peVar11->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10)
       = 0;
  *(undefined8 *)&(peVar11->priority_change_timer_).first_event_fired_ = 0;
  (peVar11->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  (peVar11->priority_change_timer_).t_created_.__d.__r = 0;
  (peVar11->priority_change_timer_).duration_us_ = 0;
  *(undefined4 *)&(peVar11->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar11;
  this->_vptr_raft_server =
       (_func_int **)
       &(peVar11->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if ((((ulong)req[2].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) == 0) &&
     (*(_func_int **)(in_RDX + 8) < req[9].super_msg_base._vptr_msg_base[1])) {
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar4 == (pointer)0x0) goto LAB_00189c7c;
    iVar9 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    ppuVar14 = (undefined **)extraout_RDX;
    if (iVar9 < 3) goto LAB_00189c7c;
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_
              ((string *)local_80,
               "received an install snapshot request (%lu) which has lower term than this server (%lu), decline the request"
               ,*(undefined8 *)(in_RDX + 8),req[9].super_msg_base._vptr_msg_base[1]);
    (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar4,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
      ,"handle_install_snapshot_req",0x111,local_80);
    ppuVar14 = (undefined **)extraout_RDX_00;
  }
  else {
    if ((*(long *)(in_RDX + 0x40) - (long)*(undefined8 **)(in_RDX + 0x38) == 0x10) &&
       (this_00 = (log_entry *)**(undefined8 **)(in_RDX + 0x38),
       this_00->value_type_ == snp_sync_req)) {
      buf = log_entry::get_buf(this_00);
      snapshot_sync_req::deserialize((snapshot_sync_req *)local_60,buf);
      if (req[2].super_msg_base._vptr_msg_base <
          (_func_int **)
          ((((ptr<snapshot> *)local_60._0_8_)->
           super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->last_log_idx_)
      {
        bVar8 = handle_snapshot_sync_req((raft_server *)req,(snapshot_sync_req *)local_60._0_8_);
        ppuVar14 = (undefined **)extraout_RDX_01;
        if (bVar8) {
          p_Var3 = *(_func_int **)(local_60._0_8_ + 0x10);
          pp_Var5 = this->_vptr_raft_server;
          if (((((ptr<snapshot> *)local_60._0_8_)->
               super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_ ==
              raw_binary) {
            sVar12 = buffer::size((((ptr<buffer> *)(local_60._0_8_ + 0x18))->
                                  super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr);
            pp_Var5[4] = p_Var3 + sVar12;
            *(undefined1 *)(pp_Var5 + 6) = 1;
            ppuVar14 = (undefined **)extraout_RDX_02;
          }
          else {
            pp_Var5[4] = p_Var3;
            *(undefined1 *)(pp_Var5 + 6) = 1;
            if (*(bool *)(local_60._0_8_ + 0x28) == true) {
              buffer::alloc((buffer *)local_80,1);
              buffer::pos((buffer *)local_80._0_8_,0);
              buffer::put((buffer *)local_80._0_8_,'\0');
              buffer::pos((buffer *)local_80._0_8_,0);
              local_60._16_8_ = local_80._0_8_;
              local_60._24_8_ = local_80._8_8_;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(_Atomic_word *)(local_80._8_8_ + 8) = *(_Atomic_word *)(local_80._8_8_ + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(_Atomic_word *)(local_80._8_8_ + 8) = *(_Atomic_word *)(local_80._8_8_ + 8) + 1;
                }
              }
              pp_Var5[7] = (_func_int *)local_80._0_8_;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(pp_Var5 + 8),
                         (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 0x18));
              ppuVar14 = (undefined **)extraout_RDX_10;
              this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._24_8_;
              goto LAB_00189c54;
            }
          }
        }
      }
      else {
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (psVar4 != (pointer)0x0) {
          iVar9 = (*(code *)(psVar4->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)()
          ;
          if (2 < iVar9) {
            psVar4 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            uVar6 = ((((ptr<snapshot> *)local_60._0_8_)->
                     super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    last_log_idx_;
            pp_Var5 = req[2].super_msg_base._vptr_msg_base;
            lVar13 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
            msg_if_given_abi_cxx11_
                      ((string *)local_80,
                       "received a snapshot (%lu) that is older than current commit idx (%lu), last log idx %lu"
                       ,uVar6,pp_Var5,lVar13 + -1);
            (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar4,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_install_snapshot_req",0x124,local_80);
            if ((buffer *)local_80._0_8_ != (buffer *)(local_80 + 0x10)) {
              operator_delete((void *)local_80._0_8_);
            }
          }
        }
        buffer::alloc((buffer *)local_80,1);
        buffer::pos((buffer *)local_80._0_8_,0);
        buffer::put((buffer *)local_80._0_8_,'\0');
        buffer::pos((buffer *)local_80._0_8_,0);
        pp_Var5 = this->_vptr_raft_server;
        local_60._32_8_ = local_80._0_8_;
        local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_80._8_8_ + 8) = *(_Atomic_word *)(local_80._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_80._8_8_ + 8) = *(_Atomic_word *)(local_80._8_8_ + 8) + 1;
          }
        }
        pp_Var5[7] = (_func_int *)local_80._0_8_;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(pp_Var5 + 8),&local_38);
        ppuVar14 = (undefined **)extraout_RDX_06;
        this_01._M_pi = local_38._M_pi;
LAB_00189c54:
        if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
          ppuVar14 = (undefined **)extraout_RDX_07;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
          ppuVar14 = (undefined **)extraout_RDX_08;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
        ppuVar14 = (undefined **)extraout_RDX_09;
      }
      goto LAB_00189c7c;
    }
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar4 == (pointer)0x0) goto LAB_00189c7c;
    iVar9 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    ppuVar14 = (undefined **)extraout_RDX_03;
    if (iVar9 < 3) goto LAB_00189c7c;
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_
              ((string *)local_80,
               "Receive an invalid InstallSnapshotRequest due to bad log entries or bad log entry value"
              );
    (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar4,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
      ,"handle_install_snapshot_req",0x119,local_80);
    ppuVar14 = (undefined **)extraout_RDX_04;
  }
  if ((buffer *)local_80._0_8_ != (buffer *)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_);
    ppuVar14 = (undefined **)extraout_RDX_05;
  }
LAB_00189c7c:
  pVar15.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar14;
  pVar15.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar15.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_install_snapshot_req(req_msg& req) {
    if (req.get_term() == state_->get_term() && !catching_up_) {
        if (role_ == srv_role::candidate) {
            become_follower();

        } else if (role_ == srv_role::leader) {
            // LCOV_EXCL_START
            p_er( "Receive InstallSnapshotRequest from another leader(%d) "
                  "with same term, there must be a bug, server exits",
                  req.get_src() );
            ctx_->state_mgr_->system_exit
                ( raft_err::N10_leader_receive_InstallSnapshotRequest );
            ::exit(-1);
            return ptr<resp_msg>();
            // LCOV_EXCL_STOP

        } else {
            restart_election_timer();
        }
    }

    ptr<resp_msg> resp = cs_new<resp_msg>
                         ( state_->get_term(),
                           msg_type::install_snapshot_response,
                           id_,
                           req.get_src(),
                           log_store_->next_slot() );

    if (!catching_up_ && req.get_term() < state_->get_term()) {
        p_wn("received an install snapshot request (%" PRIu64 ") which has lower term "
             "than this server (%" PRIu64 "), decline the request",
             req.get_term(), state_->get_term());
        return resp;
    }

    std::vector<ptr<log_entry>>& entries(req.log_entries());
    if ( entries.size() != 1 ||
         entries[0]->get_val_type() != log_val_type::snp_sync_req ) {
        p_wn("Receive an invalid InstallSnapshotRequest due to "
             "bad log entries or bad log entry value");
        return resp;
    }

    ptr<snapshot_sync_req> sync_req =
        snapshot_sync_req::deserialize(entries[0]->get_buf());
    if (sync_req->get_snapshot().get_last_log_idx() <= quick_commit_index_) {
        p_wn( "received a snapshot (%" PRIu64 ") that is older than "
              "current commit idx (%" PRIu64 "), last log idx %" PRIu64,
              sync_req->get_snapshot().get_last_log_idx(),
              quick_commit_index_.load(),
              log_store_->next_slot() - 1);
        // Put dummy CTX to end the snapshot sync.
        ptr<buffer> done_ctx = buffer::alloc(1);
        done_ctx->pos(0);
        done_ctx->put((byte)0);
        done_ctx->pos(0);
        resp->set_ctx(done_ctx);
        return resp;
    }

    if (handle_snapshot_sync_req(*sync_req)) {
        if (sync_req->get_snapshot().get_type() == snapshot::raw_binary) {
            // LCOV_EXCL_START
            // Raw binary: add received byte to offset.
            resp->accept(sync_req->get_offset() + sync_req->get_data().size());
            // LCOV_EXCL_STOP

        } else {
            // Object type: add one (next object index).
            resp->accept(sync_req->get_offset());
            if (sync_req->is_done()) {
                // TODO: check if there is missing object.
                // Add a context buffer to inform installation is done.
                ptr<buffer> done_ctx = buffer::alloc(1);
                done_ctx->pos(0);
                done_ctx->put((byte)0);
                done_ctx->pos(0);
                resp->set_ctx(done_ctx);
            }
        }
    }

    return resp;
}